

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::saveOutput(FastText *this)

{
  element_type *peVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_38;
  
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = (peVar1->output)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + (peVar1->output)._M_string_length);
  std::__cxx11::string::append((char *)&local_38);
  saveOutput(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FastText::saveOutput() {
	saveOutput(args_->output + ".output");
}